

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_job.h
# Opt level: O3

void __thiscall r_exec::PerfSamplingJob::~PerfSamplingJob(PerfSamplingJob *this)

{
  operator_delete(this);
  return;
}

Assistant:

class REPLICODE_EXPORT PerfSamplingJob:
    public TimeJob
{
public:
    uint64_t period;
    PerfSamplingJob(uint64_t start, uint64_t period);
    bool update();
    bool shouldRunAgain() const
    {
        return true;
    }
}